

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzHalfMod_fast(word *b,word *a,word *mod,size_t n)

{
  ulong uVar1;
  bool_t bVar2;
  size_t in_RCX;
  size_t sVar3;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word lo;
  word carry;
  ulong local_28;
  size_t local_20;
  
  local_28 = 0;
  bVar2 = zzIsOdd(in_RSI,in_RCX);
  local_20 = in_RCX;
  if (bVar2 == 0) {
    while (sVar3 = local_20 - 1, local_20 != 0) {
      uVar1 = in_RSI[sVar3];
      in_RDI[sVar3] = in_RSI[sVar3] >> 1 | local_28 << 0x3f;
      local_28 = uVar1 & 1;
      local_20 = sVar3;
    }
  }
  else {
    local_28 = zzAdd(in_RDI,in_RSI,in_RDX,in_RCX);
    local_20 = in_RCX;
    while (sVar3 = local_20 - 1, local_20 != 0) {
      uVar1 = in_RDI[sVar3];
      in_RDI[sVar3] = in_RDI[sVar3] >> 1 | local_28 << 0x3f;
      local_28 = uVar1 & 1;
      local_20 = sVar3;
    }
  }
  return;
}

Assistant:

void FAST(zzHalfMod)(word b[], const word a[], const word mod[], size_t n)
{
	register word carry = 0;
	register word lo;
	// pre
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(mod, b, n));
	ASSERT(zzIsOdd(mod, n) && mod[n - 1] != 0);
	ASSERT(wwCmp(a, mod, n) < 0);
	// a -- нечетное? => b <- (a + mod) / 2
	if (zzIsOdd(a, n))
	{
		carry = zzAdd(b, a, mod, n);
		while (n--)
			lo = b[n] & WORD_1,
			b[n] = b[n] >> 1 | carry << (B_PER_W - 1),
			carry = lo;
	}
	// a -- четное? => b <- a / 2
	else
		while (n--)
			lo = a[n] & WORD_1,
			b[n] = a[n] >> 1 | carry << (B_PER_W - 1),
			carry = lo;
	// очистка
	lo = carry = 0;
}